

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ExpressionConstraintSyntax *pEVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExpressionConstraintSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,(ExpressionSyntax *)args_1,&local_48)
  ;
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExpressionConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExpressionConstraintSyntax>(
        node.soft.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}